

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__pic_test(stbi__context *s)

{
  stbi_uc *psVar1;
  int iVar2;
  int iVar3;
  stbi_uc *psVar4;
  
  iVar2 = stbi__pic_is4(s,anon_var_dwarf_61e25);
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    psVar1 = s->buffer_start;
    iVar2 = 0x54;
    do {
      psVar4 = s->img_buffer;
      if (psVar4 < s->img_buffer_end) {
LAB_001243ed:
        s->img_buffer = psVar4 + 1;
      }
      else if (s->read_from_callbacks != 0) {
        iVar3 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
        s->callback_already_read =
             s->callback_already_read + (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
        if (iVar3 == 0) {
          s->read_from_callbacks = 0;
          s->img_buffer = psVar1;
          s->img_buffer_end = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
        }
        else {
          s->img_buffer = psVar1;
          s->img_buffer_end = psVar1 + iVar3;
        }
        psVar4 = s->img_buffer;
        goto LAB_001243ed;
      }
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
    iVar2 = stbi__pic_is4(s,"PICT");
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  return iVar2;
}

Assistant:

static int stbi__pic_test(stbi__context *s)
{
   int r = stbi__pic_test_core(s);
   stbi__rewind(s);
   return r;
}